

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hxx
# Opt level: O1

void __thiscall
andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertAdjacenciesForEdge
          (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *this,size_t edgeIndex)

{
  pointer pRVar1;
  pointer pEVar2;
  ulong uVar3;
  ulong uVar4;
  __normal_iterator<andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  _Var5;
  value_type local_40;
  
  pRVar1 = (this->vertices_).
           super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (this->edges_).
           super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = pEVar2[edgeIndex].vertexIndices_[0];
  uVar4 = pEVar2[edgeIndex].vertexIndices_[1];
  local_40.vertex_ = uVar4;
  local_40.edge_ = edgeIndex;
  _Var5 = std::
          __lower_bound<__gnu_cxx::__normal_iterator<andres::graph::Adjacency<unsigned_long>*,std::vector<andres::graph::Adjacency<unsigned_long>,std::allocator<andres::graph::Adjacency<unsigned_long>>>>,andres::graph::Adjacency<unsigned_long>,__gnu_cxx::__ops::_Iter_comp_val<std::less<andres::graph::Adjacency<unsigned_long>>>>
                    (*(undefined8 *)
                      &pRVar1[uVar3].vector_.
                       super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                     ,*(pointer *)
                       ((long)&pRVar1[uVar3].vector_.
                               super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                       + 8));
  if (((_Var5._M_current ==
        *(pointer *)
         ((long)&pRVar1[uVar3].vector_.
                 super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
         + 8)) || (uVar4 < (_Var5._M_current)->vertex_)) ||
     ((uVar4 == (_Var5._M_current)->vertex_ && (edgeIndex < (_Var5._M_current)->edge_)))) {
    local_40.vertex_ = uVar4;
    local_40.edge_ = edgeIndex;
    std::
    vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
    ::_M_insert_rval(&pRVar1[uVar3].vector_,(const_iterator)_Var5._M_current,&local_40);
  }
  if (uVar4 != uVar3) {
    pRVar1 = (this->vertices_).
             super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_40.vertex_ = uVar3;
    local_40.edge_ = edgeIndex;
    _Var5 = std::
            __lower_bound<__gnu_cxx::__normal_iterator<andres::graph::Adjacency<unsigned_long>*,std::vector<andres::graph::Adjacency<unsigned_long>,std::allocator<andres::graph::Adjacency<unsigned_long>>>>,andres::graph::Adjacency<unsigned_long>,__gnu_cxx::__ops::_Iter_comp_val<std::less<andres::graph::Adjacency<unsigned_long>>>>
                      (*(undefined8 *)
                        &pRVar1[uVar4].vector_.
                         super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                       ,*(pointer *)
                         ((long)&pRVar1[uVar4].vector_.
                                 super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                         + 8));
    if (((_Var5._M_current ==
          *(pointer *)
           ((long)&pRVar1[uVar4].vector_.
                   super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
           + 8)) || (uVar3 < (_Var5._M_current)->vertex_)) ||
       ((uVar3 == (_Var5._M_current)->vertex_ && (edgeIndex < (_Var5._M_current)->edge_)))) {
      local_40.vertex_ = uVar3;
      local_40.edge_ = edgeIndex;
      std::
      vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
      ::_M_insert_rval(&pRVar1[uVar4].vector_,(const_iterator)_Var5._M_current,&local_40);
    }
  }
  return;
}

Assistant:

inline void 
Graph<VISITOR>::insertAdjacenciesForEdge(
    const std::size_t edgeIndex
) {
    const Edge& edge = edges_[edgeIndex];
    const std::size_t vertexIndex0 = edge[0];
    const std::size_t vertexIndex1 = edge[1];
    vertices_[vertexIndex0].insert(
        AdjacencyType(vertexIndex1, edgeIndex)
    );
    if(vertexIndex1 != vertexIndex0) {
        vertices_[vertexIndex1].insert(
            AdjacencyType(vertexIndex0, edgeIndex)
        );
    }
}